

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u16 exprCommute(Parse *pParse,Expr *pExpr)

{
  Vdbe *pVVar1;
  Expr *pRight;
  Expr *pEVar2;
  Parse *in_RSI;
  Expr *t;
  Expr *in_stack_ffffffffffffffe0;
  Expr *in_stack_ffffffffffffffe8;
  
  if ((*(char *)&in_RSI->pVdbe->db != -0x4f) && (**(char **)&in_RSI->rc != -0x4f)) {
    pRight = (Expr *)sqlite3BinaryCompareCollSeq
                               (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    pEVar2 = (Expr *)sqlite3BinaryCompareCollSeq(in_RSI,in_stack_ffffffffffffffe8,pRight);
    if (pRight == pEVar2) goto LAB_002003bf;
  }
  *(uint *)((long)&in_RSI->db + 4) = *(uint *)((long)&in_RSI->db + 4) ^ 0x400;
LAB_002003bf:
  pVVar1 = *(Vdbe **)&in_RSI->rc;
  *(Vdbe **)&in_RSI->rc = in_RSI->pVdbe;
  in_RSI->pVdbe = pVVar1;
  if (0x36 < *(byte *)&in_RSI->db) {
    *(byte *)&in_RSI->db = (*(char *)&in_RSI->db - 0x37U ^ 2) + 0x37;
  }
  return 0;
}

Assistant:

static u16 exprCommute(Parse *pParse, Expr *pExpr){
  if( pExpr->pLeft->op==TK_VECTOR
   || pExpr->pRight->op==TK_VECTOR
   || sqlite3BinaryCompareCollSeq(pParse, pExpr->pLeft, pExpr->pRight) !=
      sqlite3BinaryCompareCollSeq(pParse, pExpr->pRight, pExpr->pLeft)
  ){
    pExpr->flags ^= EP_Commuted;
  }
  SWAP(Expr*,pExpr->pRight,pExpr->pLeft);
  if( pExpr->op>=TK_GT ){
    assert( TK_LT==TK_GT+2 );
    assert( TK_GE==TK_LE+2 );
    assert( TK_GT>TK_EQ );
    assert( TK_GT<TK_LE );
    assert( pExpr->op>=TK_GT && pExpr->op<=TK_GE );
    pExpr->op = ((pExpr->op-TK_GT)^2)+TK_GT;
  }
  return 0;
}